

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

void __thiscall
Assimp::glTF2Importer::InternReadFile
          (glTF2Importer *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  bool isBinary;
  string local_a58;
  undefined1 local_a38 [8];
  Asset asset;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  glTF2Importer *this_local;
  
  asset.scene._8_8_ = pIOHandler;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->meshOffsets);
  std::vector<int,_std::allocator<int>_>::clear(&this->embeddedTexIdxs);
  this->mScene = pScene;
  glTF2::Asset::Asset((Asset *)local_a38,(IOSystem *)asset.scene._8_8_);
  BaseImporter::GetExtension(&local_a58,pFile);
  isBinary = std::operator==(&local_a58,"glb");
  glTF2::Asset::Load((Asset *)local_a38,pFile,isBinary);
  std::__cxx11::string::~string((string *)&local_a58);
  ImportEmbeddedTextures(this,(Asset *)local_a38);
  ImportMaterials(this,(Asset *)local_a38);
  ImportMeshes(this,(Asset *)local_a38);
  ImportCameras(this,(Asset *)local_a38);
  ImportLights(this,(Asset *)local_a38);
  ImportNodes(this,(Asset *)local_a38);
  ImportAnimations(this,(Asset *)local_a38);
  if (pScene->mNumMeshes == 0) {
    pScene->mFlags = pScene->mFlags | 1;
  }
  glTF2::Asset::~Asset((Asset *)local_a38);
  return;
}

Assistant:

void glTF2Importer::InternReadFile(const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    // clean all member arrays
    meshOffsets.clear();
    embeddedTexIdxs.clear();

    this->mScene = pScene;

    // read the asset file
    glTF2::Asset asset(pIOHandler);
    asset.Load(pFile, GetExtension(pFile) == "glb");

    //
    // Copy the data out
    //

    ImportEmbeddedTextures(asset);
    ImportMaterials(asset);

    ImportMeshes(asset);

    ImportCameras(asset);
    ImportLights(asset);

    ImportNodes(asset);

    ImportAnimations(asset);

    if (pScene->mNumMeshes == 0) {
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }
}